

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O3

void dmrC_uninline(dmr_C *C,symbol *sym)

{
  symbol *psVar1;
  symbol_list *list;
  symbol_list *psVar2;
  void *pvVar3;
  statement *dst;
  undefined1 local_48 [8];
  ptr_list_iter piter__;
  
  psVar1 = (sym->field_14).field_2.ctype.base_type;
  list = (psVar1->field_14).field_2.arguments;
  psVar2 = create_symbol_list(C,(sym->field_14).field_2.inline_symbol_list);
  (sym->field_14).field_2.symbol_list = psVar2;
  ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)list);
  while( true ) {
    pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_48);
    if (pvVar3 == (void *)0x0) break;
    *(void **)((long)pvVar3 + 0x28) = pvVar3;
  }
  dst = dmrC_alloc_statement(C,psVar1->pos,3);
  (psVar1->field_14).field_2.stmt = dst;
  dmrC_copy_statement(C,(psVar1->field_14).field_2.inline_stmt,dst);
  unset_replace_list(C,(sym->field_14).field_2.symbol_list);
  unset_replace_list(C,list);
  return;
}

Assistant:

void dmrC_uninline(struct dmr_C *C, struct symbol *sym)
{
	struct symbol *fn = sym->ctype.base_type;
	struct symbol_list *arg_list = fn->arguments;
	struct symbol *p;

	sym->symbol_list = create_symbol_list(C, sym->inline_symbol_list);
	FOR_EACH_PTR(arg_list, p) {
		p->replace = p;
	} END_FOR_EACH_PTR(p);
	fn->stmt = dmrC_alloc_statement(C, fn->pos, STMT_COMPOUND);
	dmrC_copy_statement(C, fn->inline_stmt, fn->stmt);
	unset_replace_list(C, sym->symbol_list);
	unset_replace_list(C, arg_list);
}